

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

bool __thiscall
spvtools::opt::Instruction::WhileEachInId
          (Instruction *this,function<bool_(const_unsigned_int_*)> *f)

{
  bool bVar1;
  reference pOVar2;
  uint *__args;
  Operand *operand;
  const_iterator __end2;
  const_iterator __begin2;
  OperandList *__range2;
  function<bool_(const_unsigned_int_*)> *f_local;
  Instruction *this_local;
  
  __end2 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::begin
                     (&this->operands_);
  operand = (Operand *)
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::end
                      (&this->operands_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                                *)&operand);
    if (!bVar1) {
      return true;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
             ::operator*(&__end2);
    bVar1 = spvIsInIdType(pOVar2->type);
    if (bVar1) {
      __args = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar2->words,0);
      bVar1 = std::function<bool_(const_unsigned_int_*)>::operator()(f,__args);
      if (!bVar1) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

inline bool Instruction::WhileEachInId(
    const std::function<bool(const uint32_t*)>& f) const {
  for (const auto& operand : operands_) {
    if (spvIsInIdType(operand.type) && !f(&operand.words[0])) {
      return false;
    }
  }
  return true;
}